

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos)

{
  ImVec2 IVar1;
  ImGuiWindow *window;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  ImU32 col;
  ImGuiCol idx;
  float fVar5;
  float fVar6;
  ImVec2 p_min;
  bool hovered;
  bool held;
  ImRect bb;
  bool local_42;
  bool local_41;
  ImRect local_40;
  ImVec2 local_30;
  
  pIVar2 = GImGui;
  window = GImGui->CurrentWindow;
  IVar1 = (GImGui->Style).FramePadding;
  fVar5 = IVar1.x;
  fVar6 = IVar1.y;
  local_40.Max.x = fVar5 + fVar5 + GImGui->FontSize + (*pos).x;
  local_40.Max.y = fVar6 + fVar6 + GImGui->FontSize + (*pos).y;
  local_40.Min = *pos;
  ItemAdd(&local_40,id,(ImRect *)0x0);
  bVar3 = ButtonBehavior(&local_40,id,&local_42,&local_41,0);
  if ((local_41 != true) || (idx = 0x17, local_42 == false)) {
    idx = local_42 + 0x15;
  }
  col = GetColorU32(idx,1.0);
  if ((local_42 != false) || (local_41 == true)) {
    local_30.x = (local_40.Max.x + local_40.Min.x) * 0.5 + 0.0;
    local_30.y = (local_40.Max.y + local_40.Min.y) * 0.5 + -0.5;
    ImDrawList::AddCircleFilled(window->DrawList,&local_30,pIVar2->FontSize * 0.5 + 1.0,col,9);
  }
  IVar1 = (pIVar2->Style).FramePadding;
  p_min.x = IVar1.x + local_40.Min.x;
  p_min.y = IVar1.y + local_40.Min.y;
  RenderArrow(p_min,(window->Collapsed ^ 1) * 2 + 1,1.0);
  bVar4 = IsItemActive();
  if (bVar4) {
    bVar4 = IsMouseDragging(0,-1.0);
    if (bVar4) {
      StartMouseMovingWindow(window);
    }
  }
  return bVar3;
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    if (hovered || held)
        window->DrawList->AddCircleFilled(bb.GetCenter() + ImVec2(0.0f, -0.5f), g.FontSize * 0.5f + 1.0f, col, 9);
    RenderArrow(bb.Min + g.Style.FramePadding, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging())
        StartMouseMovingWindow(window);

    return pressed;
}